

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlindex.cpp
# Opt level: O0

void __thiscall QSqlIndex::QSqlIndex(QSqlIndex *this,QSqlIndex *other)

{
  QList<bool> *in_RSI;
  QList<bool> *in_RDI;
  
  QSqlRecord::QSqlRecord((QSqlRecord *)in_RSI,(QSqlRecord *)in_RDI);
  QString::QString((QString *)in_RSI,(QString *)in_RDI);
  QString::QString((QString *)in_RSI,(QString *)in_RDI);
  QList<bool>::QList(in_RSI,in_RDI);
  return;
}

Assistant:

QSqlIndex::QSqlIndex(const QSqlIndex& other)
    : QSqlRecord(other), cursor(other.cursor), nm(other.nm), sorts(other.sorts)
{
}